

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchTree.h
# Opt level: O0

Node<int> * __thiscall SearchTree::find(SearchTree *this,int *target)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  undefined4 extraout_var_01;
  int *piVar3;
  undefined4 extraout_var_02;
  SearchTree *local_30;
  Node<int> *node;
  int *piStack_20;
  bool leftFlag;
  int *target_local;
  SearchTree *this_local;
  undefined4 extraout_var_00;
  
  piStack_20 = target;
  target_local = (int *)this;
  iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this_local = (SearchTree *)0x0;
  }
  else {
    iVar1 = (*(this->super_Tree<int>)._vptr_Tree[0xb])(this,piStack_20,(long)&node + 7);
    plVar2 = (long *)CONCAT44(extraout_var_00,iVar1);
    if (plVar2 == (long *)0x0) {
      iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])();
      piVar3 = (int *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x20))();
      if (*piVar3 == *piStack_20) {
        iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])();
        this_local = (SearchTree *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        this_local = (SearchTree *)0x0;
      }
    }
    else {
      if ((node._7_1_ & 1) == 0) {
        local_30 = (SearchTree *)(**(code **)(*plVar2 + 0x40))();
      }
      else {
        local_30 = (SearchTree *)(**(code **)*plVar2)();
      }
      this_local = local_30;
    }
  }
  return (Node<int> *)this_local;
}

Assistant:

virtual Node<int>* find(int& target){
        if (getRoot() == nullptr){
            return nullptr;
        }
        bool leftFlag;
        //找寻父节点
        Node<int>* node = getParent(target, leftFlag);
        //如果是根节点
        if (node == nullptr){
            if (getRoot()->getDataNode() == target){
                return getRoot();
            }
            return nullptr;
        }
        if (leftFlag){
            node = node->getLeftPoint();
        } else{
            node = node->getRightPoint();
        }
        return node;
    }